

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ConstraintDeclarationSyntax::setChild
          (ConstraintDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c8f740 + *(int *)(&DAT_00c8f740 + in_RSI * 4)))();
  return;
}

Assistant:

void ConstraintDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: qualifiers = child.node()->as<TokenList>(); return;
        case 2: keyword = child.token(); return;
        case 3: specifiers = child.node()->as<SyntaxList<ClassSpecifierSyntax>>(); return;
        case 4: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 5: block = child.node() ? &child.node()->as<ConstraintBlockSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}